

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_attr<double>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *attr,string *name,
                   uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  Path *v;
  Animatable<double> *v_00;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  uint32_t indent_00;
  pointer pPVar7;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_01;
  byte bVar8;
  pprint *this;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *pTVar9;
  bool bVar10;
  bool bVar11;
  stringstream ss;
  string local_210;
  string *local_1f0;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_1e8;
  Animatable<double> *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pprint *)(ulong)indent;
  local_1f0 = name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar4 = attr->_empty;
  if ((((bVar4 != false) || ((attr->_attrib).has_value_ != false)) ||
      ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) || (attr->_blocked == true)) {
    bVar3 = (attr->_attrib).has_value_;
    local_1e0 = &attr->_fallback;
    if (bVar3 != false) {
      local_1e0 = (Animatable<double> *)&(attr->_attrib).contained;
    }
    pPVar2 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar7 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((local_1e0->_blocked == false) && (local_1e0->_has_value == false)) {
      bVar10 = (local_1e0->_ts)._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (local_1e0->_ts)._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar10 = false;
    }
    if (pPVar7 == pPVar2) {
      bVar8 = bVar3 ^ 1U | bVar4;
    }
    else {
      bVar8 = 0;
    }
    bVar11 = pPVar7 != pPVar2;
    local_1e8 = attr;
    bVar3 = AttrMetas::authored(&attr->_metas);
    v_00 = local_1e0;
    indent_00 = (uint32_t)pPVar7;
    n_01 = n;
    if (((bVar11 | bVar10) & ~(bVar3 | bVar8) & bVar4) == 0) {
      if (bVar4 == false) {
        pprint::Indent_abi_cxx11_(&local_210,this,n);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        paVar1 = &local_210.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_210.field_2._M_allocated_capacity._0_4_ = 0x62756f64;
        local_210.field_2._M_allocated_capacity._4_2_ = 0x656c;
        local_210._M_string_length = 6;
        local_210.field_2._M_local_buf[6] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar1;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,paVar1->_M_local_buf,6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(local_1f0->_M_dataplus)._M_p,local_1f0->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
        print_animatable_default<double>(&local_210,v_00,indent);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        pTVar9 = local_1e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
          pTVar9 = local_1e8;
        }
      }
      else {
        pprint::Indent_abi_cxx11_(&local_210,this,n);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        pTVar9 = local_1e8;
        paVar1 = &local_210.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_210.field_2._M_allocated_capacity._0_4_ = 0x62756f64;
        local_210.field_2._M_allocated_capacity._4_2_ = 0x656c;
        local_210._M_string_length = 6;
        local_210.field_2._M_local_buf[6] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar1;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,paVar1->_M_local_buf,6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(local_1f0->_M_dataplus)._M_p,local_1f0->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
      bVar4 = AttrMetas::authored(&pTVar9->_metas);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
        print_attr_metas_abi_cxx11_
                  (&local_210,(tinyusdz *)pTVar9,(AttrMeta *)(ulong)(indent + 1),indent_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        pprint::Indent_abi_cxx11_(&local_1d8,this,n_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    if ((v_00->_ts)._dirty == true) {
      TypedTimeSamples<double>::update(&v_00->_ts);
      n_01 = extraout_EDX_00;
    }
    pTVar9 = local_1e8;
    if ((v_00->_ts)._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (v_00->_ts)._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&local_210,this,n_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x62756f64;
      local_210.field_2._M_allocated_capacity._4_2_ = 0x656c;
      local_210._M_string_length = 6;
      local_210.field_2._M_local_buf[6] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(local_1f0->_M_dataplus)._M_p,local_1f0->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
      print_animatable_timesamples<double>(&local_210,local_1e0,indent);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX_01;
    }
    if ((pTVar9->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        (pTVar9->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
        .super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&local_210,this,n_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x62756f64;
      local_210.field_2._M_allocated_capacity._4_2_ = 0x656c;
      local_210._M_string_length = 6;
      local_210.field_2._M_local_buf[6] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(local_1f0->_M_dataplus)._M_p,local_1f0->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      v = (pTVar9->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
          _M_impl.super__Vector_impl_data._M_start;
      lVar6 = ((long)(pTVar9->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar6 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar6 == 1) {
        std::operator<<(local_1a8,v);
      }
      else {
        std::operator<<(local_1a8,&pTVar9->_paths);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}